

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O2

int comex_accs(int datatype,void *scale,void *src_ptr,int *src_stride_ar,void *dst_ptr,
              int *dst_stride_ar,int *count,int stride_levels,int proc,comex_group_t group)

{
  size_t __n;
  int iVar1;
  int count_00;
  ulong uVar2;
  int *message;
  long lVar3;
  ulong uVar4;
  int iVar5;
  char *__assertion;
  void *__src;
  long lVar6;
  int iVar7;
  int size;
  int local_b4 [7];
  int src_bunit [7];
  int dst_bunit [7];
  int aiStack_58 [10];
  
  iVar1 = comex_group_size(group,&size);
  if (iVar1 == 0) {
    if (proc < 0) {
      __assertion = "proc >= 0";
    }
    else {
      if (proc < size) {
        if (group != 0) {
          comex_group_translate_world(group,proc,src_bunit);
          proc = src_bunit[0];
        }
        uVar2 = 0;
        uVar4 = 0;
        if (0 < stride_levels) {
          uVar4 = (ulong)(uint)stride_levels;
        }
        iVar1 = 1;
        for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
          iVar1 = iVar1 * count[uVar2 + 1];
        }
        local_b4[0] = 0;
        aiStack_58[1] = 0;
        src_bunit[0] = 1;
        src_bunit[1] = 1;
        dst_bunit[0] = 1;
        dst_bunit[1] = 1;
        for (lVar3 = 2; lVar3 <= stride_levels; lVar3 = lVar3 + 1) {
          local_b4[lVar3 + -1] = 0;
          aiStack_58[lVar3] = 0;
          iVar7 = count[lVar3 + -1];
          src_bunit[lVar3] = src_bunit[lVar3 + -1] * iVar7;
          dst_bunit[lVar3] = iVar7 * dst_bunit[lVar3 + -1];
        }
        if (iVar1 < 1) {
          iVar1 = 0;
        }
        iVar7 = 0;
        while( true ) {
          if (iVar7 == iVar1) {
            comex_make_progress();
            return 0;
          }
          iVar7 = iVar7 + 1;
          lVar3 = 0;
          for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
            lVar3 = lVar3 + (long)src_stride_ar[uVar2] * (long)local_b4[uVar2];
            iVar5 = local_b4[uVar2] + (uint)(iVar7 % src_bunit[uVar2 + 1] == 0);
            if (count[uVar2 + 1] <= iVar5) {
              iVar5 = 0;
            }
            local_b4[uVar2] = iVar5;
          }
          lVar6 = 0;
          for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
            lVar6 = lVar6 + (long)dst_stride_ar[uVar2] * (long)aiStack_58[uVar2 + 1];
            iVar5 = aiStack_58[uVar2 + 1] + (uint)(iVar7 % dst_bunit[uVar2 + 1] == 0);
            if (count[uVar2 + 1] <= iVar5) {
              iVar5 = 0;
            }
            aiStack_58[uVar2 + 1] = iVar5;
          }
          if (5 < datatype - 0x25U) break;
          __src = (void *)(lVar3 + (long)src_ptr);
          iVar5 = *count;
          if (l_state.rank == proc) {
            _acc(datatype,iVar5,(void *)(lVar6 + (long)dst_ptr),__src,scale);
          }
          else {
            __n = *(size_t *)(&DAT_001b0488 + (ulong)(datatype - 0x25U) * 8);
            count_00 = (int)__n + iVar5 + 0x28;
            message = (int *)_my_malloc((long)count_00);
            *message = datatype + -0x22;
            *(void **)(message + 2) = (void *)(lVar6 + (long)dst_ptr);
            *(void **)(message + 4) = __src;
            message[6] = iVar5;
            message[8] = 0;
            message[9] = 0;
            memcpy(message + 10,scale,__n);
            memcpy((void *)((long)message + __n + 0x28),__src,(long)iVar5);
            fence_array[proc] = '\x01';
            _mq_push(proc,(char *)message,count_00);
            _make_progress_if_needed();
          }
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x2c2,"int _acc_nbi(void *, void *, int, int, int, void *)");
      }
      __assertion = "proc < size";
    }
  }
  else {
    __assertion = "COMEX_SUCCESS == ierr";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x3b1,
                "int comex_accs(int, void *, void *, int *, void *, int *, int *, int, int, comex_group_t)"
               );
}

Assistant:

int comex_accs(
        int datatype, void *scale,
        void *src_ptr, int *src_stride_ar,
        void *dst_ptr, int *dst_stride_ar,
        int *count, int stride_levels,
        int proc, comex_group_t group)
{
    int i, j;
    long src_idx, dst_idx;  /* index offset of current block position to ptr */
    int n1dim;  /* number of 1 dim block */
    int src_bvalue[7], src_bunit[7];
    int dst_bvalue[7], dst_bunit[7];

    CHECK_GROUP(group,proc);
#if DEBUG
    if (stride_levels) {
        printf("[%d] comex_accs(src_ptr=%p, src_stride_ar[0]=%d, dst_ptr=%p, dst_stride_ar[0]=%d, count[0]=%d, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, src_stride_ar[0], dst_ptr, dst_stride_ar[0], count[0], stride_levels, proc);
    }
    else {
        printf("[%d] comex_accs(src_ptr=%p, src_stride_ar=NULL, dst_ptr=%p, dst_stride_ar=NULL, count=NULL, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, dst_ptr, stride_levels, proc);
    }
#endif

    /* number of n-element of the first dimension */
    n1dim = 1;
    for(i=1; i<=stride_levels; i++) {
        n1dim *= count[i];
    }

    /* calculate the destination indices */
    src_bvalue[0] = 0; src_bvalue[1] = 0; src_bunit[0] = 1; src_bunit[1] = 1;
    dst_bvalue[0] = 0; dst_bvalue[1] = 0; dst_bunit[0] = 1; dst_bunit[1] = 1;

    for(i=2; i<=stride_levels; i++) {
        src_bvalue[i] = 0;
        dst_bvalue[i] = 0;
        src_bunit[i] = src_bunit[i-1] * count[i-1];
        dst_bunit[i] = dst_bunit[i-1] * count[i-1];
    }

    /* index mangling */
    for(i=0; i<n1dim; i++) {
        src_idx = 0;
        dst_idx = 0;
        for(j=1; j<=stride_levels; j++) {
	  src_idx += (long) src_bvalue[j] * (long) src_stride_ar[j-1];
            if((i+1) % src_bunit[j] == 0) {
                src_bvalue[j]++;
            }
            if(src_bvalue[j] > (count[j]-1)) {
                src_bvalue[j] = 0;
            }
        }

        for(j=1; j<=stride_levels; j++) {
	  dst_idx += (long) dst_bvalue[j] * (long) dst_stride_ar[j-1];
            if((i+1) % dst_bunit[j] == 0) {
                dst_bvalue[j]++;
            }
            if(dst_bvalue[j] > (count[j]-1)) {
                dst_bvalue[j] = 0;
            }
        }
        
        _acc_nbi((char *)src_ptr + src_idx, 
                (char *)dst_ptr + dst_idx, count[0], proc,
                datatype, scale);
    }

    comex_wait_proc(proc, group);

    return COMEX_SUCCESS;
}